

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void loopfilter_frame(AV1_COMP *cpi,AV1_COMMON *cm)

{
  int iVar1;
  int iVar2;
  uint use_loopfilter_00;
  int use_superres_00;
  int use_restoration_00;
  uint partial_frame;
  int unaff_EBX;
  AV1_COMMON *in_RSI;
  AV1_COMP *in_RDI;
  AV1LfSync *unaff_retaddr;
  int in_stack_00000008;
  int lpf_opt_level;
  loopfilter *lf;
  uint skip_apply_postproc_filters;
  int use_restoration;
  int use_superres;
  int use_cdef;
  int use_loopfilter;
  MACROBLOCKD *xd;
  int num_planes;
  int num_workers;
  MultiThreadInfo *mt_info;
  LPF_PICK_METHOD in_stack_000000c7;
  AV1_COMP *in_stack_000000c8;
  YV12_BUFFER_CONFIG *in_stack_000000d0;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  byte local_55;
  undefined8 in_stack_ffffffffffffffb0;
  loopfilter *plVar3;
  uint skip_apply_postproc_filters_00;
  int in_stack_ffffffffffffffb8;
  AV1_COMP *cpi_00;
  int iVar4;
  
  skip_apply_postproc_filters_00 = (uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  iVar4 = (in_RDI->mt_info).num_mod_workers[5];
  iVar1 = av1_num_planes(in_RSI);
  cpi_00 = (AV1_COMP *)&(in_RDI->td).mb.e_mbd;
  (in_RDI->td).mb.rdmult = (in_RDI->rd).RDMULT;
  iVar2 = is_loopfilter_used(in_RSI);
  local_55 = 0;
  if (iVar2 != 0) {
    local_55 = (in_RDI->mt_info).pipeline_lpf_mt_with_enc != 0 ^ 0xff;
  }
  use_loopfilter_00 = (uint)(local_55 & 1);
  iVar2 = is_cdef_used(in_RSI);
  use_superres_00 = av1_superres_scaled(in_RSI);
  use_restoration_00 = is_restoration_used(in_RSI);
  partial_frame =
       derive_skip_apply_postproc_filters
                 (in_RDI,use_loopfilter_00,iVar2,use_superres_00,use_restoration_00);
  if (use_loopfilter_00 != 0) {
    av1_pick_filter_level(in_stack_000000d0,in_stack_000000c8,in_stack_000000c7);
    plVar3 = &in_RSI->lf;
    if (((plVar3->filter_level[0] != 0) || ((in_RSI->lf).filter_level[1] != 0)) &&
       ((partial_frame & 8) == 0)) {
      get_lpf_opt_level((SPEED_FEATURES *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      av1_loop_filter_frame_mt
                ((YV12_BUFFER_CONFIG *)CONCAT44(iVar4,iVar1),(AV1_COMMON *)cpi_00,
                 (MACROBLOCKD *)CONCAT44(use_loopfilter_00,iVar2),use_superres_00,use_restoration_00
                 ,partial_frame,(AVxWorker *)in_RDI,unaff_EBX,unaff_retaddr,in_stack_00000008);
    }
    skip_apply_postproc_filters_00 = (uint)((ulong)plVar3 >> 0x20);
  }
  cdef_restoration_frame
            (cpi_00,(AV1_COMMON *)CONCAT44(use_loopfilter_00,iVar2),
             (MACROBLOCKD *)CONCAT44(use_superres_00,use_restoration_00),partial_frame,
             in_stack_ffffffffffffffb8,skip_apply_postproc_filters_00);
  return;
}

Assistant:

static void loopfilter_frame(AV1_COMP *cpi, AV1_COMMON *cm) {
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  const int num_workers = mt_info->num_mod_workers[MOD_LPF];
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *xd = &cpi->td.mb.e_mbd;
  cpi->td.mb.rdmult = cpi->rd.RDMULT;

  assert(IMPLIES(is_lossless_requested(&cpi->oxcf.rc_cfg),
                 cm->features.coded_lossless && cm->features.all_lossless));

  const int use_loopfilter =
      is_loopfilter_used(cm) && !cpi->mt_info.pipeline_lpf_mt_with_enc;
  const int use_cdef = is_cdef_used(cm);
  const int use_superres = av1_superres_scaled(cm);
  const int use_restoration = is_restoration_used(cm);

  const unsigned int skip_apply_postproc_filters =
      derive_skip_apply_postproc_filters(cpi, use_loopfilter, use_cdef,
                                         use_superres, use_restoration);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, loop_filter_time);
#endif
  if (use_loopfilter) {
    av1_pick_filter_level(cpi->source, cpi, cpi->sf.lpf_sf.lpf_pick);
    struct loopfilter *lf = &cm->lf;
    if ((lf->filter_level[0] || lf->filter_level[1]) &&
        (skip_apply_postproc_filters & SKIP_APPLY_LOOPFILTER) == 0) {
      assert(!cpi->ppi->rtc_ref.non_reference_frame);
      // lpf_opt_level = 1 : Enables dual/quad loop-filtering.
      // lpf_opt_level is set to 1 if transform size search depth in inter
      // blocks is limited to one as quad loop filtering assumes that all the
      // transform blocks within a 16x8/8x16/16x16 prediction block are of the
      // same size. lpf_opt_level = 2 : Filters both chroma planes together, in
      // addition to enabling dual/quad loop-filtering. This is enabled when lpf
      // pick method is LPF_PICK_FROM_Q as u and v plane filter levels are
      // equal.
      int lpf_opt_level = get_lpf_opt_level(&cpi->sf);
      av1_loop_filter_frame_mt(&cm->cur_frame->buf, cm, xd, 0, num_planes, 0,
                               mt_info->workers, num_workers,
                               &mt_info->lf_row_sync, lpf_opt_level);
    }
  }

#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, loop_filter_time);
#endif

  cdef_restoration_frame(cpi, cm, xd, use_restoration, use_cdef,
                         skip_apply_postproc_filters);
}